

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O0

void __thiscall
burst::
intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
::settle(intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
         *this)

{
  type_conflict4 tVar1;
  bool bVar2;
  iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  *piVar3;
  reference piVar4;
  reference piVar5;
  reference piVar6;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_a0;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_88;
  undefined4 local_70;
  undefined1 local_68 [8];
  outer_range_iterator range;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_40;
  undefined1 local_28 [8];
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  max_range;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  *this_local;
  
  max_range.m_iterator._M_current = (iterator_range<std::_List_const_iterator<int>_> *)this;
  tVar1 = boost::iterators::operator!=
                    ((iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                      *)this,(iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                              *)&this->m_end);
  if (tVar1) {
    owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
    ::owning_iterator(&local_40,&this->m_end);
    std::
    prev<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>,std::allocator<boost::iterator_range<std::_List_const_iterator<int>>>>>>
              ((owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                *)local_28,&local_40,1);
    owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
    ::~owning_iterator(&local_40);
    owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
    ::owning_iterator((owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                       *)local_68,&this->m_begin);
    while (tVar1 = boost::iterators::operator!=
                             ((iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                               *)local_68,
                              (iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                               *)local_28), tVar1) {
      piVar3 = (iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                *)boost::iterators::detail::
                  iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                  ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                                *)local_68);
      piVar4 = boost::iterator_range_detail::
               iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               ::front(piVar3);
      piVar3 = (iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                *)boost::iterators::detail::
                  iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                  ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                                *)local_28);
      piVar5 = boost::iterator_range_detail::
               iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               ::front(piVar3);
      bVar2 = std::greater<void>::operator()((greater<void> *)&this->field_0x30,piVar4,piVar5);
      if (bVar2) {
        piVar6 = boost::iterators::detail::
                 iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                 ::operator*((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                              *)local_68);
        piVar3 = (iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                  *)boost::iterators::detail::
                    iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                    ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                                  *)local_28);
        piVar4 = boost::iterator_range_detail::
                 iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                 ::front(piVar3);
        skip_to_lower_bound<boost::iterator_range<std::_List_const_iterator<int>>,int,std::greater<void>>
                  (piVar6,piVar4);
        piVar3 = (iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                  *)boost::iterators::detail::
                    iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                    ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                                  *)local_68);
        bVar2 = boost::iterator_range_detail::
                iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                ::empty(piVar3);
        if (bVar2) {
          scroll_to_end(this);
          local_70 = 1;
          goto LAB_003f5865;
        }
      }
      piVar3 = (iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                *)boost::iterators::detail::
                  iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                  ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                                *)local_28);
      piVar4 = boost::iterator_range_detail::
               iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               ::front(piVar3);
      piVar3 = (iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                *)boost::iterators::detail::
                  iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                  ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                                *)local_68);
      piVar5 = boost::iterator_range_detail::
               iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               ::front(piVar3);
      bVar2 = std::greater<void>::operator()((greater<void> *)&this->field_0x30,piVar4,piVar5);
      if (bVar2) {
        owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
        ::owning_iterator(&local_88,
                          (owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                           *)local_28);
        owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
        ::owning_iterator(&local_a0,
                          (owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                           *)local_68);
        std::
        iter_swap<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>,std::allocator<boost::iterator_range<std::_List_const_iterator<int>>>>>,burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>,std::allocator<boost::iterator_range<std::_List_const_iterator<int>>>>>>
                  (&local_88,&local_a0);
        owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
        ::~owning_iterator(&local_a0);
        owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
        ::~owning_iterator(&local_88);
        owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
        ::operator=((owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                     *)local_68,&this->m_begin);
      }
      else {
        boost::iterators::detail::
        iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
        ::operator++((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                      *)local_68);
      }
    }
    local_70 = 0;
LAB_003f5865:
    owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
    ::~owning_iterator((owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                        *)local_68);
    owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
    ::~owning_iterator((owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                        *)local_28);
  }
  return;
}

Assistant:

void settle ()
        {
            if (m_begin != m_end)
            {
                const auto max_range = std::prev(m_end);

                auto range = m_begin;
                while (range != max_range)
                {
                    if (m_compare(range->front(), max_range->front()))
                    {
                        skip_to_lower_bound(*range, max_range->front(), m_compare);
                        if (range->empty())
                        {
                            scroll_to_end();
                            return;
                        }
                    }

                    if (m_compare(max_range->front(), range->front()))
                    {
                        // Возможно, тут надо продвинуть последний диапазон до нового минимума и
                        // посмотреть, нужно ли его после этого менять местами с текущим
                        // диапазоном. Возможно, это будет цикл.
                        std::iter_swap(max_range, range);
                        range = m_begin;
                    }
                    else
                    {
                        ++range;
                    }
                }
            }
        }